

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool google::protobuf::anon_unknown_24::RetrieveOptions
               (int depth,Message *options,DescriptorPool *pool,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *option_entries)

{
  char *pcVar1;
  bool bVar2;
  Symbol type;
  MessageLite *pMVar3;
  MessageLite *this;
  string_view str;
  string_view v;
  Metadata MVar4;
  string_view name;
  string serialized;
  DynamicMessageFactory factory;
  LogMessage local_f0;
  string local_e0;
  DynamicMessageFactory local_c0;
  CodedInputStream local_80;
  
  MVar4 = Message::GetMetadata(options);
  if ((MVar4.descriptor)->file_->pool_ != pool) {
    MVar4 = Message::GetMetadata(options);
    pcVar1 = ((MVar4.descriptor)->all_names_).payload_;
    name._M_len = (ulong)*(ushort *)(pcVar1 + 2);
    name._M_str = pcVar1 + ~name._M_len;
    type = DescriptorPool::Tables::FindByNameHelper
                     ((pool->tables_)._M_t.
                      super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                      .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                      _M_head_impl,pool,name);
    if ((type.ptr_)->symbol_type_ == '\x01') {
      DynamicMessageFactory::DynamicMessageFactory(&local_c0);
      pMVar3 = &DynamicMessageFactory::GetPrototype(&local_c0,(Descriptor *)type.ptr_)->
                super_MessageLite;
      this = MessageLite::New(pMVar3,(Arena *)0x0);
      MessageLite::SerializeAsString_abi_cxx11_(&local_e0,&options->super_MessageLite);
      local_80.buffer_ = (uint8_t *)local_e0._M_dataplus._M_p;
      local_80.buffer_end_ = (uint8_t *)(local_e0._M_dataplus._M_p + (int)local_e0._M_string_length)
      ;
      local_80.input_ = (ZeroCopyInputStream *)0x0;
      local_80._28_7_ = 0;
      local_80._35_4_ = 0;
      local_80.buffer_size_after_limit_ = 0;
      local_80.total_bytes_limit_ = 0x7fffffff;
      local_80.recursion_budget_ = io::CodedInputStream::default_recursion_limit_;
      local_80.recursion_limit_ = io::CodedInputStream::default_recursion_limit_;
      local_80.extension_pool_ = pool;
      local_80.extension_factory_ = &local_c0.super_MessageFactory;
      bVar2 = MessageLite::ParseFromCodedStream(this,&local_80);
      pMVar3 = this;
      if (!bVar2) {
        absl::lts_20250127::log_internal::LogMessage::LogMessage
                  (&local_f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0xdbc);
        str._M_str = "Found invalid proto option data for: ";
        str._M_len = 0x25;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (&local_f0,str);
        MVar4 = Message::GetMetadata(options);
        pcVar1 = ((MVar4.descriptor)->all_names_).payload_;
        v._M_len = (ulong)*(ushort *)(pcVar1 + 2);
        v._M_str = pcVar1 + ~v._M_len;
        absl::lts_20250127::log_internal::LogMessage::operator<<(&local_f0,v);
        absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_f0);
        pMVar3 = &options->super_MessageLite;
      }
      bVar2 = RetrieveOptionsAssumingRightPool(depth,(Message *)pMVar3,option_entries);
      io::CodedInputStream::~CodedInputStream(&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      (*this->_vptr_MessageLite[1])(this);
      DynamicMessageFactory::~DynamicMessageFactory(&local_c0);
      return bVar2;
    }
  }
  bVar2 = RetrieveOptionsAssumingRightPool(depth,options,option_entries);
  return bVar2;
}

Assistant:

bool RetrieveOptions(int depth, const Message& options,
                     const DescriptorPool* pool,
                     std::vector<std::string>* option_entries) {
  // When printing custom options for a descriptor, we must use an options
  // message built on top of the same DescriptorPool where the descriptor
  // is coming from. This is to ensure we are interpreting custom options
  // against the right pool.
  if (options.GetDescriptor()->file()->pool() == pool) {
    return RetrieveOptionsAssumingRightPool(depth, options, option_entries);
  } else {
    const Descriptor* option_descriptor =
        pool->FindMessageTypeByName(options.GetDescriptor()->full_name());
    if (option_descriptor == nullptr) {
      // descriptor.proto is not in the pool. This means no custom options are
      // used so we are safe to proceed with the compiled options message type.
      return RetrieveOptionsAssumingRightPool(depth, options, option_entries);
    }
    DynamicMessageFactory factory;
    std::unique_ptr<Message> dynamic_options(
        factory.GetPrototype(option_descriptor)->New());
    std::string serialized = options.SerializeAsString();
    io::CodedInputStream input(
        reinterpret_cast<const uint8_t*>(serialized.data()), serialized.size());
    input.SetExtensionRegistry(pool, &factory);
    if (dynamic_options->ParseFromCodedStream(&input)) {
      return RetrieveOptionsAssumingRightPool(depth, *dynamic_options,
                                              option_entries);
    } else {
      ABSL_LOG(ERROR) << "Found invalid proto option data for: "
                      << options.GetDescriptor()->full_name();
      return RetrieveOptionsAssumingRightPool(depth, options, option_entries);
    }
  }
}